

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
pbrt::SubsurfaceMaterial::SubsurfaceMaterial
          (SubsurfaceMaterial *this,Float scale,SpectrumTextureHandle *sigma_a,
          SpectrumTextureHandle *sigma_s,SpectrumTextureHandle *reflectance,
          SpectrumTextureHandle *mfp,Float g,Float eta,FloatTextureHandle *uRoughness,
          FloatTextureHandle *vRoughness,FloatTextureHandle *displacement,bool remapRoughness,
          Allocator alloc)

{
  BSSRDFTable *in_RSI;
  long in_RDI;
  Float in_XMM0_Da;
  undefined4 in_XMM2_Da;
  int unaff_retaddr;
  int unaff_retaddr_00;
  BSSRDFTable *in_stack_00000008;
  Allocator in_stack_00000010;
  byte in_stack_00000018;
  FloatTextureHandle *in_stack_ffffffffffffff48;
  BSSRDFTable *t;
  Float in_stack_ffffffffffffffe0;
  
  t = in_RSI;
  FloatTextureHandle::FloatTextureHandle((FloatTextureHandle *)in_RSI,in_stack_ffffffffffffff48);
  *(Float *)(in_RDI + 8) = in_XMM0_Da;
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_stack_ffffffffffffff48);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_stack_ffffffffffffff48);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_stack_ffffffffffffff48);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RSI,(SpectrumTextureHandle *)in_stack_ffffffffffffff48);
  FloatTextureHandle::FloatTextureHandle((FloatTextureHandle *)in_RSI,in_stack_ffffffffffffff48);
  FloatTextureHandle::FloatTextureHandle((FloatTextureHandle *)in_RSI,in_stack_ffffffffffffff48);
  *(undefined4 *)(in_RDI + 0x40) = in_XMM2_Da;
  *(byte *)(in_RDI + 0x44) = in_stack_00000018 & 1;
  BSSRDFTable::BSSRDFTable(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_00000010);
  ComputeBeamDiffusionBSSRDF(in_XMM0_Da,in_stack_ffffffffffffffe0,t);
  return;
}

Assistant:

SubsurfaceMaterial(Float scale, SpectrumTextureHandle sigma_a,
                       SpectrumTextureHandle sigma_s, SpectrumTextureHandle reflectance,
                       SpectrumTextureHandle mfp, Float g, Float eta,
                       FloatTextureHandle uRoughness, FloatTextureHandle vRoughness,
                       FloatTextureHandle displacement, bool remapRoughness,
                       Allocator alloc)
        : displacement(displacement),
          scale(scale),
          sigma_a(sigma_a),
          sigma_s(sigma_s),
          reflectance(reflectance),
          mfp(mfp),
          uRoughness(uRoughness),
          vRoughness(vRoughness),
          eta(eta),
          remapRoughness(remapRoughness),
          table(100, 64, alloc) {
        ComputeBeamDiffusionBSSRDF(g, eta, &table);
    }